

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_sol.h
# Opt level: O0

void __thiscall ExampleSOLHandler::PrintSolution(ExampleSOLHandler *this,string *stub)

{
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  ExampleModel *pEVar4;
  reference pdVar5;
  pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>
  *in_RDI;
  double v;
  iterator __end2;
  iterator __begin2;
  vector<double,_std::allocator<double>_> *__range2;
  pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>
  suf;
  iterator __end1_2;
  iterator __begin1_2;
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
  *__range1_2;
  double x;
  iterator __end1_1;
  iterator __begin1_1;
  vector<double,_std::allocator<double>_> *__range1_1;
  double y;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
  *in_stack_ffffffffffffff08;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff10;
  pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>
  *this_00;
  undefined4 in_stack_ffffffffffffff18;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_c8;
  vector<double,_std::allocator<double>_> *local_c0;
  pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>
  local_a8;
  _Self local_68;
  _Self local_60;
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
  *local_58;
  double local_50;
  double *local_48;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_40;
  vector<double,_std::allocator<double>_> *local_38;
  double local_30;
  double *local_28;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_20;
  vector<double,_std::allocator<double>_> *local_18;
  
  uVar3 = std::__cxx11::string::c_str();
  printf("\n     ********** SOLUTION (%s.sol) ***********\n",uVar3);
  printf("%s\n","Duals:");
  pEVar4 = Model((ExampleSOLHandler *)in_RDI);
  local_18 = &pEVar4->sol_y_;
  local_20._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff08);
  local_28 = (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff08);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff10,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_ffffffffffffff08);
    if (!bVar1) break;
    pdVar5 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_20);
    local_30 = *pdVar5;
    printf("%.17g\t",local_30);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_20);
  }
  printf("\n%s\n","Primals:");
  pEVar4 = Model((ExampleSOLHandler *)in_RDI);
  local_38 = &pEVar4->sol_x_;
  local_40._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff08);
  local_48 = (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff08);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff10,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_ffffffffffffff08);
    if (!bVar1) break;
    pdVar5 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_40);
    local_50 = *pdVar5;
    printf("%.17g\t",local_50);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_40);
  }
  pEVar4 = Model((ExampleSOLHandler *)in_RDI);
  uVar2 = pEVar4->objno_ + 1;
  pEVar4 = Model((ExampleSOLHandler *)in_RDI);
  printf("\nObjno used: %d, solve_result_num: %d\n",(ulong)uVar2,(ulong)(uint)pEVar4->solve_result_)
  ;
  printf("\n%s\n","Suffixes:");
  pEVar4 = Model((ExampleSOLHandler *)in_RDI);
  local_58 = &pEVar4->suf_out_;
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
       ::begin(in_stack_ffffffffffffff08);
  local_68._M_node =
       (_Base_ptr)
       std::
       map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
       ::end(in_stack_ffffffffffffff08);
  while( true ) {
    bVar1 = std::operator!=(&local_60,&local_68);
    if (!bVar1) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>_>
                 *)0x104ac1);
    this_00 = &local_a8;
    std::
    pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>
    ::pair(in_RDI,(pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>
                   *)CONCAT44(uVar2,in_stack_ffffffffffffff18));
    uVar3 = std::__cxx11::string::c_str();
    printf("  %s  [kind=%d]: ",uVar3,(ulong)(uint)local_a8.first.second);
    local_c0 = &local_a8.second;
    local_c8._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff08);
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff08);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)this_00,
                         (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)in_stack_ffffffffffffff08);
      if (!bVar1) break;
      pdVar5 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_c8);
      printf("\t%.17g",*pdVar5);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_c8);
    }
    printf("\n");
    std::
    pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>
    ::~pair(this_00);
    std::
    _Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>_>
                  *)this_00);
  }
  printf("%s\n","");
  return;
}

Assistant:

void ExampleSOLHandler::PrintSolution(
    const std::string& stub) {
  printf(
        "\n     ********** SOLUTION (%s.sol) ***********\n",
        stub.c_str());
  printf("%s\n", "Duals:");
  for (auto y: Model().sol_y_)
    printf("%.17g\t", y);
  printf("\n%s\n", "Primals:");
  for (auto x: Model().sol_x_)
    printf("%.17g\t", x);

  printf("\nObjno used: %d, solve_result_num: %d\n",
         Model().objno_+1, Model().solve_result_);

  printf("\n%s\n", "Suffixes:");
  for (auto suf: Model().suf_out_) {
    printf("  %s  [kind=%d]: ",
           suf.first.first.c_str(), suf.first.second);
    for (auto v: suf.second)
      printf("\t%.17g", v);
    printf("\n");
  }
  printf("%s\n", "");
}